

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressionAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TypedAttribute<Imf_3_3::Compression>::readValueFrom
          (TypedAttribute<Imf_3_3::Compression> *this,IStream *is,int size,int version)

{
  bool bVar1;
  uchar *in_RDI;
  uchar tmp;
  undefined7 in_stack_ffffffffffffffe0;
  byte in_stack_ffffffffffffffe7;
  
  Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>
            ((IStream *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),in_RDI);
  bVar1 = isValidCompression((uint)in_stack_ffffffffffffffe7);
  if (!bVar1) {
    in_stack_ffffffffffffffe7 = 10;
  }
  *(uint *)(in_RDI + 8) = (uint)in_stack_ffffffffffffffe7;
  return;
}

Assistant:

IMF_EXPORT void
CompressionAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    unsigned char tmp;
    Xdr::read<StreamIO> (is, tmp);

    //
    // prevent invalid values being written to Compression enum
    // by forcing all unknown types to NUM_COMPRESSION_METHODS which is also an invalid
    // pixel type, but can be used as a PixelType enum value
    // (Header::sanityCheck will throw an exception when files with invalid Compression types are read)
    //

    if (!isValidCompression (tmp)) { tmp = NUM_COMPRESSION_METHODS; }

    _value = Compression (tmp);
}